

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O3

void __thiscall ON_AerialPhotoCameraPosition::UnsetOrientation(ON_AerialPhotoCameraPosition *this)

{
  double dVar1;
  long lVar2;
  ON_Xform *pOVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  
  bVar5 = 0;
  this->m_status = this->m_status & 0xfd;
  ON_3dVector::Set(&this->m_orientation_angles_radians,-1.23432101234321e+308,-1.23432101234321e+308
                   ,-1.23432101234321e+308);
  ON_3dVector::Set(&this->m_orientation_angles_degrees,-1.23432101234321e+308,-1.23432101234321e+308
                   ,-1.23432101234321e+308);
  pOVar3 = &ON_Xform::Zero4x4;
  pOVar4 = &this->m_orientation_rotation;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pOVar4->m_xform[0][0] = pOVar3->m_xform[0][0];
    pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  (this->m_orientation_right).z = ON_3dVector::ZeroVector.z;
  dVar1 = ON_3dVector::ZeroVector.y;
  (this->m_orientation_right).x = ON_3dVector::ZeroVector.x;
  (this->m_orientation_right).y = dVar1;
  dVar1 = ON_3dVector::ZeroVector.y;
  (this->m_orientation_up).x = ON_3dVector::ZeroVector.x;
  (this->m_orientation_up).y = dVar1;
  (this->m_orientation_up).z = ON_3dVector::ZeroVector.z;
  dVar1 = ON_3dVector::ZeroVector.y;
  (this->m_orientation_direction).x = ON_3dVector::ZeroVector.x;
  (this->m_orientation_direction).y = dVar1;
  (this->m_orientation_direction).z = ON_3dVector::ZeroVector.z;
  return;
}

Assistant:

void ON_AerialPhotoCameraPosition::UnsetOrientation()
{
  m_status &= 0xFD; // clear bit 2

  m_orientation_angles_radians.Set(ON_UNSET_VALUE,ON_UNSET_VALUE,ON_UNSET_VALUE);
  m_orientation_angles_degrees.Set(ON_UNSET_VALUE,ON_UNSET_VALUE,ON_UNSET_VALUE);

  m_orientation_rotation = ON_Xform::Zero4x4;

  m_orientation_right = ON_3dVector::ZeroVector;
  m_orientation_up = ON_3dVector::ZeroVector;
  m_orientation_direction = ON_3dVector::ZeroVector;
}